

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::MeshLoader::loadTexBinormalSourceElement(MeshLoader *this,InputShared *input)

{
  ulong uVar1;
  Semantic *pSVar2;
  ulong uVar3;
  bool bVar4;
  SourceBase *sourceBase;
  String *pSVar5;
  ostream *poVar6;
  ulong uVar7;
  MeshLoader *this_00;
  URI *copyFrom_;
  Semantic semantic;
  String sourceId;
  URI inputUrl;
  Semantic local_13c;
  String local_138;
  URI local_118;
  
  local_13c = (input->super_InputUnshared).mSemantic;
  if (local_13c != TEXBINORMAL) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The current input element is not a TEXBINORMAL element!",0x37)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    return false;
  }
  copyFrom_ = &(input->super_InputUnshared).mSource;
  COLLADABU::URI::URI(&local_118,copyFrom_,false);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_118.mFragment._M_dataplus._M_p,
             local_118.mFragment._M_dataplus._M_p + local_118.mFragment._M_string_length);
  this_00 = this;
  sourceBase = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_138);
  if (sourceBase != (SourceBase *)0x0) {
    uVar1 = (sourceBase->mLoadedInputElements).mCount;
    if (uVar1 == 0) {
LAB_00804f3e:
      if (sourceBase->mStride == 3) {
        bVar4 = appendVertexValues(this_00,sourceBase,&this->mMesh->mBinormals);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"The binormal source ",0x14);
        pSVar5 = COLLADABU::URI::getURIString_abi_cxx11_(copyFrom_);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(pSVar5->_M_dataplus)._M_p,
                            pSVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," has a wrong dimension of ",0x1a)
        ;
        poVar6 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,". Dimensions must be 3.",0x17);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        bVar4 = false;
      }
      SourceBase::addLoadedInputElement(sourceBase,&local_13c);
      goto LAB_00805005;
    }
    pSVar2 = (sourceBase->mLoadedInputElements).mData;
    if (*pSVar2 != TEXBINORMAL) {
      uVar3 = 1;
      do {
        uVar7 = uVar3;
        if (uVar1 == uVar7) break;
        uVar3 = uVar7 + 1;
      } while (pSVar2[uVar7] != TEXBINORMAL);
      if (uVar1 <= uVar7) goto LAB_00804f3e;
    }
  }
  bVar4 = false;
LAB_00805005:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  COLLADABU::URI::~URI(&local_118);
  return bVar4;
}

Assistant:

bool MeshLoader::loadTexBinormalSourceElement ( const InputShared& input )
    {
        bool retValue = true;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        if ( semantic != InputSemantic::TEXBINORMAL )
        {
            std::cerr << "The current input element is not a TEXBINORMAL element!" << std::endl;
            return false;
        }

        // Get the source element with the uri of the input element.
        COLLADABU::URI inputUrl = input.getSource ();
        String sourceId = inputUrl.getFragment ();
        SourceBase* sourceBase = getSourceById ( sourceId );
        if ( sourceBase == 0 ) return false;

        // Check if the source element is already loaded.
        if ( sourceBase->isLoadedInputElement ( semantic ) ) return false;

        // Get the stride of the uv coordinates. 
        // This is the dimension of the uv coordinates.
        // In depend on the dimension, we store the coordinates in the mesh.
        unsigned long long stride = sourceBase->getStride ();
        if ( stride !=  3 )
        {
            std::cerr << "The binormal source " <<  input.getSource().getURIString () 
                << " has a wrong dimension of " << stride 
                << ". Dimensions must be 3." << std::endl;
            retValue = false;
        }
        else
        {
            COLLADAFW::MeshVertexData& colors = mMesh->getBinormals ();
            retValue = appendVertexValues ( sourceBase, colors );
        }

        // Set the source base as loaded element.
        sourceBase->addLoadedInputElement ( semantic );

        return retValue;
    }